

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

uint * __thiscall
kj::_::NullableValue<unsigned_int>::emplace<unsigned_int&>
          (NullableValue<unsigned_int> *this,uint *params)

{
  uint *params_00;
  uint *params_local;
  NullableValue<unsigned_int> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<unsigned_int>(&(this->field_1).value);
  }
  params_00 = fwd<unsigned_int&>(params);
  ctor<unsigned_int,unsigned_int&>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (uint *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }